

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

stbtt__buf stbtt__get_subrs(stbtt__buf cff,stbtt__buf fontdict)

{
  uint uVar1;
  undefined8 in_RSI;
  long in_RDI;
  stbtt__buf sVar2;
  stbtt_uint32 subrsoff;
  stbtt_uint32 private_loc [2];
  stbtt_uint32 local_4c;
  stbtt__buf local_48;
  undefined8 local_38;
  stbtt__buf local_30;
  stbtt__buf local_20;
  
  local_48.size = (int)((ulong)in_RSI >> 0x20);
  local_4c = 0;
  local_38 = 0;
  stbtt__dict_get_ints(&local_20,0x12,2,(stbtt_uint32 *)&local_38);
  uVar1 = local_38._4_4_;
  sVar2 = (stbtt__buf)ZEXT816(0);
  if ((uint)local_38 != 0 && (ulong)local_38._4_4_ != 0) {
    if ((int)((uint)local_38 | local_38._4_4_) < 0) {
      local_30.data = (uchar *)0x0;
      local_30._8_8_ = 0;
    }
    else {
      local_30.data = (uchar *)0x0;
      local_30._8_8_ = 0;
      if ((int)(uint)local_38 <= (int)(local_48.size - local_38._4_4_) &&
          (int)local_38._4_4_ <= local_48.size) {
        local_30.data = (uchar *)(in_RDI + (ulong)local_38._4_4_);
        local_30._8_8_ = local_38 << 0x20;
      }
    }
    stbtt__dict_get_ints(&local_30,0x13,1,&local_4c);
    if (local_4c == 0) {
      sVar2 = (stbtt__buf)ZEXT416(0);
    }
    else {
      local_48.cursor = local_4c + uVar1;
      if ((local_48.cursor < 0) || (local_48.size < local_48.cursor)) {
        __assert_fail("!(o > b->size || o < 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_truetype.h"
                      ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
      }
      sVar2 = stbtt__cff_get_index(&local_48);
    }
  }
  return sVar2;
}

Assistant:

static stbtt__buf stbtt__get_subrs(stbtt__buf cff, stbtt__buf fontdict)
{
   stbtt_uint32 subrsoff = 0, private_loc[2] = { 0, 0 };
   stbtt__buf pdict;
   stbtt__dict_get_ints(&fontdict, 18, 2, private_loc);
   if (!private_loc[1] || !private_loc[0]) return stbtt__new_buf(NULL, 0);
   pdict = stbtt__buf_range(&cff, private_loc[1], private_loc[0]);
   stbtt__dict_get_ints(&pdict, 19, 1, &subrsoff);
   if (!subrsoff) return stbtt__new_buf(NULL, 0);
   stbtt__buf_seek(&cff, private_loc[1]+subrsoff);
   return stbtt__cff_get_index(&cff);
}